

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O3

void spdlog::initialize_logger(shared_ptr<spdlog::logger> *logger)

{
  shared_ptr<spdlog::logger> local_18;
  
  details::registry::instance();
  local_18.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  details::registry::initialize_logger(&details::registry::instance::s_instance,&local_18);
  if (local_18.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_18.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return;
  }
  return;
}

Assistant:

SPDLOG_INLINE void initialize_logger(std::shared_ptr<logger> logger)
{
    details::registry::instance().initialize_logger(std::move(logger));
}